

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O1

void __thiscall Liby::Buffer::Buffer(Buffer *this,string *buf)

{
  pointer __src;
  char *__dest;
  ulong uVar1;
  size_t __n;
  
  __n = buf->_M_string_length + 1;
  uVar1 = 0xffffffffffffffff;
  if (-1 < (long)__n) {
    uVar1 = __n;
  }
  __src = (buf->_M_dataplus)._M_p;
  this->rightIndex_ = 0;
  this->capacity_ = 0;
  this->buffer_ = (char *)0x0;
  this->leftIndex_ = 0;
  __dest = (char *)operator_new__(uVar1);
  this->buffer_ = __dest;
  memcpy(__dest,__src,__n);
  this->leftIndex_ = 0;
  this->rightIndex_ = __n;
  this->capacity_ = __n;
  return;
}

Assistant:

Buffer::Buffer(const std::string &buf) : Buffer(buf.data(), buf.size() + 1) {}